

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O0

void __thiscall booster::locale::util::gregorian_facet::~gregorian_facet(gregorian_facet *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__gregorian_facet_002ec3e8;
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  calendar_facet::~calendar_facet((calendar_facet *)0x2a6e94);
  return;
}

Assistant:

gregorian_facet(std::string const &terr,size_t refs = 0) : 
            calendar_facet(refs),
            terr_(terr)
        {
        }